

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsNonSemanticInstruction(Instruction *this)

{
  bool bVar1;
  Op OVar2;
  uint32_t id;
  IRContext *this_00;
  DefUseManager *this_01;
  Operand *this_02;
  long lVar3;
  undefined1 local_40 [8];
  string import_name;
  Instruction *import_inst;
  Instruction *this_local;
  
  bVar1 = HasResultId(this);
  if (bVar1) {
    OVar2 = opcode(this);
    if (OVar2 == OpExtInst) {
      this_00 = context(this);
      this_01 = IRContext::get_def_use_mgr(this_00);
      id = GetSingleWordInOperand(this,0);
      import_name.field_2._8_8_ = analysis::DefUseManager::GetDef(this_01,id);
      this_02 = GetInOperand((Instruction *)import_name.field_2._8_8_,0);
      Operand::AsString_abi_cxx11_((string *)local_40,this_02);
      lVar3 = std::__cxx11::string::find(local_40,0x5dff74);
      this_local._7_1_ = lVar3 == 0;
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsNonSemanticInstruction() const {
  if (!HasResultId()) return false;
  if (opcode() != spv::Op::OpExtInst) return false;

  auto import_inst =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(0));
  std::string import_name = import_inst->GetInOperand(0).AsString();
  return import_name.find("NonSemantic.") == 0;
}